

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O2

void minWord3(word *a,word *b,word *minimal,int nVars)

{
  int iVar1;
  
  iVar1 = memCompare(a,b,nVars);
  if (iVar1 < 1) {
    iVar1 = memCompare(a,minimal,nVars);
    if (-1 < iVar1) {
      return;
    }
    Kit_TruthCopy_64bit(minimal,a,nVars);
  }
  iVar1 = memCompare(b,minimal,nVars);
  if (0 < iVar1) {
    return;
  }
  Kit_TruthCopy_64bit(minimal,b,nVars);
  return;
}

Assistant:

static inline void minWord3(word* a, word* b, word* minimal, int nVars)
{ 
    if (memCompare(a, b, nVars) <= 0)
    {
        if (memCompare(a, minimal, nVars) < 0) 
            Kit_TruthCopy_64bit( minimal, a, nVars ); 
        else 
            return ;
    }	
    if (memCompare(b, minimal, nVars) <= 0)
        Kit_TruthCopy_64bit( minimal, b, nVars );
}